

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

OldToNew __thiscall
wasm::Debug::LocationUpdater::getCompileUnitBasesForLoc(LocationUpdater *this,size_t offset)

{
  size_type sVar1;
  mapped_type *pmVar2;
  const_iterator cVar3;
  OldToNew OVar4;
  mapped_type local_30;
  mapped_type index;
  
  local_30._0_4_ = (int)offset;
  sVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&(this->locToUnitMap)._M_h,(key_type *)&local_30);
  if (sVar1 != 0) {
    local_30 = CONCAT44(local_30._4_4_,(int)offset);
    pmVar2 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->locToUnitMap,(key_type *)&local_30);
    local_30 = *pmVar2;
    cVar3 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->compileUnitBases)._M_h,&local_30);
    if (cVar3.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      return *(OldToNew *)
              ((long)cVar3.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<unsigned_int,_unsigned_int>_>,_false>
                     ._M_cur + 0x10);
    }
  }
  OVar4.first = 0;
  OVar4.second = 0;
  return OVar4;
}

Assistant:

OldToNew getCompileUnitBasesForLoc(size_t offset) const {
    if (locToUnitMap.count(offset) == 0) {
      // There is no compile unit for this loc. It doesn't matter what we set
      // here.
      return OldToNew{0, 0};
    }
    auto index = locToUnitMap.at(offset);
    auto iter = compileUnitBases.find(index);
    if (iter != compileUnitBases.end()) {
      return iter->second;
    }
    return OldToNew{0, 0};
  }